

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

bool QApplicationPrivate::shouldSetFocus(QWidget *w,FocusPolicy policy)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  FocusPolicy FVar4;
  QWidget *this;
  
  this = w;
  while (lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78), lVar1 != 0) {
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x30));
    if (!bVar3) break;
    lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
    lVar2 = *(long *)(lVar1 + 0x30);
    this = (QWidget *)0x0;
    if ((lVar2 != 0) && (this = (QWidget *)0x0, *(int *)(lVar2 + 4) != 0)) {
      this = *(QWidget **)(lVar1 + 0x38);
    }
  }
  FVar4 = QWidget::focusPolicy(w);
  if ((policy & ~FVar4) == NoFocus) {
    if (this != w) {
      FVar4 = QWidget::focusPolicy(this);
      if ((policy & ~FVar4) != NoFocus) goto LAB_002c1386;
    }
    bVar3 = true;
  }
  else {
LAB_002c1386:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool QApplicationPrivate::shouldSetFocus(QWidget *w, Qt::FocusPolicy policy)
{
    QWidget *f = w;
    while (f->d_func()->extra && f->d_func()->extra->focus_proxy)
        f = f->d_func()->extra->focus_proxy;

    if ((w->focusPolicy() & policy) != policy)
        return false;
    if (w != f && (f->focusPolicy() & policy) != policy)
        return false;
    return true;
}